

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_rawequal(lua_State *L)

{
  int iVar1;
  TValue *o1;
  TValue *o2;
  
  o1 = lj_lib_checkany(L,1);
  o2 = lj_lib_checkany(L,2);
  iVar1 = lj_obj_equal(o1,o2);
  *(int *)((long)L->top + -4) = -2 - iVar1;
  return 1;
}

Assistant:

LJLIB_CF(rawequal)		LJLIB_REC(.)
{
  cTValue *o1 = lj_lib_checkany(L, 1);
  cTValue *o2 = lj_lib_checkany(L, 2);
  setboolV(L->top-1, lj_obj_equal(o1, o2));
  return 1;
}